

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O1

void triangle_points_plot
               (char *file_name,double *node_xy,int node_show,int point_num,double *point_xy,
               int point_show)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  long local_2b8;
  ofstream file_unit;
  byte abStack_298 [216];
  ios_base local_1c0 [268];
  int local_b4;
  double local_b0;
  double local_a8;
  double local_a0;
  ulong local_98;
  int local_8c;
  double local_88;
  double local_80;
  ulong local_78;
  double local_70;
  int local_64;
  double *local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  uVar10 = (ulong)(uint)point_num;
  local_b4 = point_show;
  local_8c = node_show;
  local_38 = node_xy;
  std::ofstream::ofstream(&local_2b8);
  dVar12 = r8_huge();
  lVar5 = 0;
  dVar12 = -dVar12;
  do {
    local_70 = *(double *)((long)local_38 + lVar5);
    if (*(double *)((long)local_38 + lVar5) <= dVar12) {
      local_70 = dVar12;
    }
    lVar5 = lVar5 + 0x10;
    dVar12 = local_70;
  } while (lVar5 != 0x30);
  if (0 < point_num) {
    lVar5 = 0;
    do {
      dVar12 = *(double *)((long)point_xy + lVar5);
      if (*(double *)((long)point_xy + lVar5) <= local_70) {
        dVar12 = local_70;
      }
      local_70 = dVar12;
      lVar5 = lVar5 + 0x10;
    } while (uVar10 << 4 != lVar5);
  }
  local_98 = uVar10;
  dVar12 = r8_huge();
  lVar5 = 0;
  do {
    local_88 = *(double *)((long)local_38 + lVar5);
    if (dVar12 <= *(double *)((long)local_38 + lVar5)) {
      local_88 = dVar12;
    }
    lVar5 = lVar5 + 0x10;
    dVar12 = local_88;
  } while (lVar5 != 0x30);
  if (0 < point_num) {
    lVar5 = 0;
    do {
      dVar12 = *(double *)((long)point_xy + lVar5);
      if (local_88 <= *(double *)((long)point_xy + lVar5)) {
        dVar12 = local_88;
      }
      local_88 = dVar12;
      lVar5 = lVar5 + 0x10;
    } while (local_98 << 4 != lVar5);
  }
  dVar12 = r8_huge();
  local_b0 = (local_70 - local_88) * 0.05 + local_70;
  local_88 = (local_70 - local_88) * -0.05 + local_88;
  local_70 = local_b0 - local_88;
  lVar5 = 8;
  dVar12 = -dVar12;
  do {
    local_80 = *(double *)((long)local_38 + lVar5);
    if (*(double *)((long)local_38 + lVar5) <= dVar12) {
      local_80 = dVar12;
    }
    lVar5 = lVar5 + 0x10;
    dVar12 = local_80;
  } while (lVar5 != 0x38);
  if (0 < point_num) {
    lVar5 = 0;
    do {
      dVar12 = *(double *)((long)point_xy + lVar5 + 8);
      if (dVar12 <= local_80) {
        dVar12 = local_80;
      }
      local_80 = dVar12;
      lVar5 = lVar5 + 0x10;
    } while (local_98 << 4 != lVar5);
  }
  dVar12 = r8_huge();
  lVar5 = 8;
  do {
    dVar13 = *(double *)((long)local_38 + lVar5);
    if (dVar12 <= *(double *)((long)local_38 + lVar5)) {
      dVar13 = dVar12;
    }
    lVar5 = lVar5 + 0x10;
    dVar12 = dVar13;
  } while (lVar5 != 0x38);
  if (0 < point_num) {
    lVar5 = 0;
    do {
      dVar12 = *(double *)((long)point_xy + lVar5 + 8);
      if (dVar13 <= dVar12) {
        dVar12 = dVar13;
      }
      dVar13 = dVar12;
      lVar5 = lVar5 + 0x10;
    } while (local_98 << 4 != lVar5);
  }
  local_a8 = (local_80 - dVar13) * 0.05 + local_80;
  local_80 = (local_80 - dVar13) * -0.05 + dVar13;
  local_a0 = local_a8 - local_80;
  if (local_a0 <= local_70) {
    iVar2 = 0x12;
    local_50 = (double)CONCAT44(local_50._4_4_,0x24);
    local_78 = CONCAT44(local_78._4_4_,0x252);
    local_58 = (double)CONCAT44(local_58._4_4_,0x240);
    if (local_a0 < local_70) {
      iVar3 = r8_nint(((local_70 - local_a0) * 540.0) / (local_70 + local_70));
      local_48 = (double)CONCAT44(local_48._4_4_,0x29a - iVar3);
      local_40 = (double)CONCAT44(local_40._4_4_,iVar3 + 0x7e);
      local_64 = 0x2ac - iVar3;
      local_60 = (double *)(ulong)(iVar3 + 0x6c);
      goto LAB_0020dfc1;
    }
  }
  else {
    iVar2 = r8_nint(((local_a0 - local_70) * 540.0) / (local_a0 + local_a0));
    local_58 = (double)CONCAT44(local_58._4_4_,0x240 - iVar2);
    local_50 = (double)CONCAT44(local_50._4_4_,iVar2 + 0x24);
    local_78 = CONCAT44(local_78._4_4_,0x252 - iVar2);
    iVar2 = iVar2 + 0x12;
  }
  local_60 = (double *)0x6c;
  local_40 = (double)CONCAT44(local_40._4_4_,0x7e);
  local_64 = 0x2ac;
  local_48 = (double)CONCAT44(local_48._4_4_,0x29a);
LAB_0020dfc1:
  std::ofstream::open((char *)&local_2b8,(_Ios_Openmode)file_name);
  if ((abStack_298[*(long *)(local_2b8 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TRIANGLE_POINTS_PLOT - Fatal error!\n",0x24);
    std::operator<<((ostream *)&std::cerr,"  Could not open the output EPS file.\n");
    exit(1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%//PS-Adobe-3.0 EPSF-3.0\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%%Creator: triangulation_order3_plot.C\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%Title: ",9);
  if (file_name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(local_2b8 + -0x18) + (int)&stack0xfffffffffffffff8 +
                    0xfffffd50);
  }
  else {
    sVar6 = strlen(file_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,file_name,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%Pages: 1\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%BoundingBox:  ",0x10);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,local_50._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_58._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_48._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%%Document-Fonts: Times-Roman\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%%LanguageLevel: 1\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%EndComments\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%BeginProlog\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"/inch {72 mul} def\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%EndProlog\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%Page: 1 1\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"save\n",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  Set the RGB line color to very light gray.\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"0.900  0.900  0.900 setrgbcolor\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  Draw a gray border around the page.\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"newpath\n",8);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,local_50._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  moveto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,local_58._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,local_58._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_48._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,local_50._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_48._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,local_50._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"stroke\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  Set the RGB color to black.\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"0.000  0.000  0.000 setrgbcolor\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  Set the font and its size.\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"/Times-Roman findfont\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"0.50 inch scalefont\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"setfont\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  Print a title.\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  210  702  moveto\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  (Triangulation)  show\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"%  Define a clipping polygon.\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"newpath\n",8);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  moveto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,(int)local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,(int)local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_64);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_64);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  lineto\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"clip newpath\n",0xd);
  local_50 = (double)local_50._0_4_;
  local_58 = (double)local_58._0_4_;
  local_40 = (double)local_40._0_4_;
  local_48 = (double)local_48._0_4_;
  local_78 = uVar10;
  if (-1 < local_8c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Set the RGB color to red.\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.900  0.200  0.100 setrgbcolor\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Draw the triangle.\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"newpath\n",8);
    iVar2 = 0;
    do {
      iVar3 = i4_wrap(iVar2,0,2);
      iVar4 = r8_nint(((local_b0 - local_38[iVar3 * 2]) * local_50 +
                      (local_38[iVar3 * 2] - local_88) * local_58) / local_70);
      iVar3 = r8_nint(((local_a8 - local_38[(int)(iVar3 * 2 | 1)]) * local_40 +
                      (local_38[(int)(iVar3 * 2 | 1)] - local_80) * local_48) / local_a0);
      if (iVar2 == 0) {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        pcVar8 = "  moveto\n";
      }
      else {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        pcVar8 = "  lineto\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,9);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"stroke\n",7);
  }
  local_60 = point_xy;
  if (0 < local_8c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Draw filled dots at the nodes.\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Set the RGB color to blue.\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.000  0.150  0.750 setrgbcolor\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    lVar5 = 8;
    do {
      dVar12 = *(double *)((long)local_38 + lVar5 + -8);
      iVar2 = r8_nint(((local_b0 - dVar12) * local_50 + (dVar12 - local_88) * local_58) / local_70);
      iVar3 = r8_nint(((local_a8 - *(double *)((long)local_38 + lVar5)) * local_40 +
                      (*(double *)((long)local_38 + lVar5) - local_80) * local_48) / local_a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"newpath  ",9);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  0 360 arc closepath fill\n",0x1b)
      ;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x38);
  }
  if (1 < local_8c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Label the nodes:\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Set the RGB color to darker blue.\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.000  0.250  0.850 setrgbcolor\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"/Times-Roman findfont\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.20 inch scalefont\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"setfont\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    pdVar1 = local_38;
    iVar2 = 1;
    for (lVar5 = 8; lVar5 != 0x38; lVar5 = lVar5 + 0x10) {
      dVar12 = *(double *)((long)pdVar1 + lVar5 + -8);
      iVar3 = r8_nint(((local_b0 - dVar12) * local_50 + (dVar12 - local_88) * local_58) / local_70);
      dVar12 = *(double *)((long)pdVar1 + lVar5);
      iVar4 = r8_nint(((local_a8 - dVar12) * local_40 + (dVar12 - local_80) * local_48) / local_a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"  ",2);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4 + 5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  moveto (",10);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
      iVar2 = iVar2 + 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") show\n",7);
    }
  }
  local_38 = (double *)CONCAT44(local_38._4_4_,5);
  iVar2 = (int)local_78;
  if (((200 < iVar2) && (local_38 = (double *)CONCAT44(local_38._4_4_,4), 500 < iVar2)) &&
     (local_38 = (double *)CONCAT44(local_38._4_4_,3), 1000 < iVar2)) {
    local_38 = (double *)CONCAT44(local_38._4_4_,(iVar2 < 0x1389) + 1);
  }
  if (0 < local_b4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    uVar10 = local_78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Draw filled dots at the points.\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Set the RGB color to green.\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.150  0.750  0.000 setrgbcolor\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    if (0 < (int)uVar10) {
      local_98 = local_98 << 4;
      uVar10 = 0;
      do {
        iVar2 = r8_nint(((local_b0 - *(double *)((long)local_60 + uVar10)) * local_50 +
                        (*(double *)((long)local_60 + uVar10) - local_88) * local_58) / local_70);
        dVar12 = *(double *)((long)local_60 + uVar10 + 8);
        iVar3 = r8_nint(((local_a8 - dVar12) * local_40 + (dVar12 - local_80) * local_48) / local_a0
                       );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"newpath  ",9);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"  0 360 arc closepath fill\n",0x1b);
        uVar10 = uVar10 + 0x10;
      } while (local_98 != uVar10);
    }
  }
  if (1 < local_b4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    uVar10 = local_78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Label the point:\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"%  Set the RGB color to darker green.\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.250  0.850  0.000 setrgbcolor\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"/Times-Roman findfont\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"0.20 inch scalefont\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"setfont\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
    uVar11 = 0;
    uVar9 = uVar10 & 0xffffffff;
    if ((int)uVar10 < 1) {
      uVar9 = uVar11;
    }
    iVar2 = 1;
    for (; uVar9 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
      iVar3 = r8_nint(((local_b0 - *(double *)((long)local_60 + uVar11)) * local_50 +
                      (*(double *)((long)local_60 + uVar11) - local_88) * local_58) / local_70);
      dVar12 = *(double *)((long)local_60 + uVar11 + 8);
      iVar4 = r8_nint(((local_a8 - dVar12) * local_40 + (dVar12 - local_80) * local_48) / local_a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"  ",2);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4 + 5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  moveto (",10);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
      iVar2 = iVar2 + 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") show\n",7);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"restore  showpage\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%  End of page.\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%Trailer\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"%%EOF\n",6);
  std::ofstream::close();
  local_2b8 = _VTT;
  *(undefined8 *)((long)&local_2b8 + *(long *)(_VTT + -0x18)) = _log;
  std::filebuf::~filebuf((filebuf *)&file_unit);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void triangle_points_plot ( char *file_name, double node_xy[], int node_show, 
  int point_num, double point_xy[], int point_show )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_POINTS_PLOT plots a triangle and some points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, char *FILE_NAME, the name of the output file.
//
//    Input, double NODE_XY[2*3], the coordinates of the nodes
//    of the triangle.
//
//    Input, int NODE_SHOW,
//   -1, do not show the triangle, or the nodes.
//    0, show the triangle, do not show the nodes;
//    1, show the triangle and the nodes;
//    2, show the triangle, the nodes and number them.
//
//    Input, int POINT_NUM, the number of points.
//
//    Input, double POINT_XY[2*POINT_NUM], the coordinates of the 
//    points.
//
//    Input, int POINT_SHOW,
//    0, do not show the points;
//    1, show the points;
//    2, show the points and number them.
//
{
  int circle_size;
  int delta;
  std::ofstream file_unit;
  int i;
  int node;
  int node_num = 3;
  int point;
  double x_max;
  double x_min;
  int x_ps;
  int x_ps_max = 576;
  int x_ps_max_clip = 594;
  int x_ps_min = 36;
  int x_ps_min_clip = 18;
  double x_scale;
  double y_max;
  double y_min;
  int y_ps;
  int y_ps_max = 666;
  int y_ps_max_clip = 684;
  int y_ps_min = 126;
  int y_ps_min_clip = 108;
  double y_scale;
//
//  We need to do some figuring here, so that we can determine
//  the range of the data, and hence the height and width
//  of the piece of paper.
//
  x_max = -r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( x_max < node_xy[0+node*2] )
    {
      x_max = node_xy[0+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( x_max < point_xy[0+point*2] )
    {
      x_max = point_xy[0+point*2];
    }
  }

  x_min = r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( node_xy[0+node*2] < x_min )
    {
      x_min = node_xy[0+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( point_xy[0+point*2] < x_min )
    {
      x_min = point_xy[0+point*2];
    }
  }
  x_scale = x_max - x_min;

  x_max = x_max + 0.05 * x_scale;
  x_min = x_min - 0.05 * x_scale;
  x_scale = x_max - x_min;

  y_max = -r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( y_max < node_xy[1+node*2] )
    {
      y_max = node_xy[1+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( y_max < point_xy[1+point*2] )
    {
      y_max = point_xy[1+point*2];
    }
  }

  y_min = r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( node_xy[1+node*2] < y_min )
    {
      y_min = node_xy[1+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( point_xy[1+point*2] < y_min )
    {
      y_min = point_xy[1+point*2];
    }
  }
  y_scale = y_max - y_min;

  y_max = y_max + 0.05 * y_scale;
  y_min = y_min - 0.05 * y_scale;
  y_scale = y_max - y_min;

  if ( x_scale < y_scale )
  {
    delta = r8_nint ( double( x_ps_max - x_ps_min ) 
      * ( y_scale - x_scale ) / ( 2.0 * y_scale ) );

    x_ps_max = x_ps_max - delta;
    x_ps_min = x_ps_min + delta;

    x_ps_max_clip = x_ps_max_clip - delta;
    x_ps_min_clip = x_ps_min_clip + delta;

    x_scale = y_scale;
  }
  else if ( y_scale < x_scale )
  {
    delta = r8_nint ( double( y_ps_max - y_ps_min ) 
      * ( x_scale - y_scale ) / ( 2.0 * x_scale ) );

    y_ps_max      = y_ps_max - delta;
    y_ps_min      = y_ps_min + delta;

    y_ps_max_clip = y_ps_max_clip - delta;
    y_ps_min_clip = y_ps_min_clip + delta;

    y_scale = x_scale;
  }

  file_unit.open ( file_name );

  if ( !file_unit )
  {
    std::cerr << "\n";
    std::cerr << "TRIANGLE_POINTS_PLOT - Fatal error!\n";
    std::cerr << "  Could not open the output EPS file.\n";
    exit ( 1 );
  }

  file_unit << "%//PS-Adobe-3.0 EPSF-3.0\n";
  file_unit << "%%Creator: triangulation_order3_plot.C\n";
  file_unit << "%%Title: " << file_name << "\n";
  file_unit << "%%Pages: 1\n";
  file_unit << "%%BoundingBox:  "
    << x_ps_min << "  "
    << y_ps_min << "  "
    << x_ps_max << "  "
    << y_ps_max << "\n";
  file_unit << "%%Document-Fonts: Times-Roman\n";
  file_unit << "%%LanguageLevel: 1\n";
  file_unit << "%%EndComments\n";
  file_unit << "%%BeginProlog\n";
  file_unit << "/inch {72 mul} def\n";
  file_unit << "%%EndProlog\n";
  file_unit << "%%Page: 1 1\n";
  file_unit << "save\n";
  file_unit << "%\n";
  file_unit << "%  Set the RGB line color to very light gray.\n";
  file_unit << "%\n";
  file_unit << "0.900  0.900  0.900 setrgbcolor\n";
  file_unit << "%\n";
  file_unit << "%  Draw a gray border around the page.\n";
  file_unit << "%\n";
  file_unit << "newpath\n";
  file_unit << x_ps_min << "  "
            << y_ps_min << "  moveto\n";
  file_unit << x_ps_max << "  "
            << y_ps_min << "  lineto\n";
  file_unit << x_ps_max << "  "
            << y_ps_max << "  lineto\n";
  file_unit << x_ps_min << "  "
            << y_ps_max << "  lineto\n";
  file_unit << x_ps_min << "  "
            << y_ps_min << "  lineto\n";
  file_unit << "stroke\n";
  file_unit << "%\n";
  file_unit << "%  Set the RGB color to black.\n";
  file_unit << "%\n";
  file_unit << "0.000  0.000  0.000 setrgbcolor\n";
  file_unit << "%\n";
  file_unit << "%  Set the font and its size.\n";
  file_unit << "%\n";
  file_unit << "/Times-Roman findfont\n";
  file_unit << "0.50 inch scalefont\n";
  file_unit << "setfont\n";
  file_unit << "%\n";
  file_unit << "%  Print a title.\n";
  file_unit << "%\n";
  file_unit << "%  210  702  moveto\n";
  file_unit << "%  (Triangulation)  show\n";
  file_unit << "%\n";
  file_unit << "%  Define a clipping polygon.\n";
  file_unit << "%\n";
  file_unit << "newpath\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_min_clip << "  moveto\n";
  file_unit << x_ps_max_clip << "  "
            << y_ps_min_clip << "  lineto\n";
  file_unit << x_ps_max_clip << "  "
            << y_ps_max_clip << "  lineto\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_max_clip << "  lineto\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_min_clip << "  lineto\n";
  file_unit << "clip newpath\n";
//
//  Draw the triangle.
//
  if ( 0 <= node_show )
  {
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to red.\n";
    file_unit << "%\n";
    file_unit << "0.900  0.200  0.100 setrgbcolor\n";
    file_unit << "%\n";
    file_unit << "%  Draw the triangle.\n";
    file_unit << "%\n";

    file_unit << "newpath\n";

    for ( i = 0; i <= 3; i++ )
    {
      node = i4_wrap ( i, 0, 2 );

      x_ps = ( r8_nint ) ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (         node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = ( r8_nint ) ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      if ( i == 0 )
      {
        file_unit << x_ps << "  " << y_ps << "  moveto\n";
      }
      else
      {
        file_unit << x_ps << "  " << y_ps << "  lineto\n";
      }
    }
    file_unit << "stroke\n";
  }
//
//  Draw the nodes.
//
  if ( 1 <= node_show )
  {
    circle_size = 5;

    file_unit << "%\n";
    file_unit << "%  Draw filled dots at the nodes.\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to blue.\n";
    file_unit << "%\n";
    file_unit << "0.000  0.150  0.750 setrgbcolor\n";
    file_unit << "%\n";

    for ( node = 0; node < 3; node++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (         node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      file_unit << "newpath  " << x_ps 
                << "  " << y_ps
                << "  " << circle_size
                << "  0 360 arc closepath fill\n";
    }
  }
//
//  Label the nodes.
//
  if ( 2 <= node_show )
  {
    file_unit << "%\n";
    file_unit << "%  Label the nodes:\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to darker blue.\n";
    file_unit << "%\n";
    file_unit << "0.000  0.250  0.850 setrgbcolor\n";
    file_unit << "/Times-Roman findfont\n";
    file_unit << "0.20 inch scalefont\n";
    file_unit << "setfont\n";
    file_unit << "%\n";

    for ( node = 0; node < node_num; node++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (       + node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      file_unit  << "  " << x_ps
                 << "  " << y_ps + 5
                 << "  moveto (" << node+1 << ") show\n";
    }
  }
//
//  Draw the points.
//
  if ( point_num <= 200 )
  {
    circle_size = 5;
  }
  else if ( point_num <= 500 )
  {
    circle_size = 4;
  }
  else if ( point_num <= 1000 )
  {
    circle_size = 3;
  }
  else if ( point_num <= 5000 )
  {
    circle_size = 2;
  }
  else
  {
    circle_size = 1;
  }

  if ( 1 <= point_show )
  {
    file_unit << "%\n";
    file_unit << "%  Draw filled dots at the points.\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to green.\n";
    file_unit << "%\n";
    file_unit << "0.150  0.750  0.000 setrgbcolor\n";
    file_unit << "%\n";

    for ( point = 0; point < point_num; point++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - point_xy[0+point*2]         ) * double( x_ps_min )   
        + (         point_xy[0+point*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                       - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - point_xy[1+point*2]         ) * double( y_ps_min )   
        + (         point_xy[1+point*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                       - y_min ) );

      file_unit << "newpath  " << x_ps 
                << "  " << y_ps
                << "  " << circle_size
                << "  0 360 arc closepath fill\n";
    }
  }
//
//  Label the points.
//
  if ( 2 <= point_show )
  {
    file_unit << "%\n";
    file_unit << "%  Label the point:\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to darker green.\n";
    file_unit << "%\n";
    file_unit << "0.250  0.850  0.000 setrgbcolor\n";
    file_unit << "/Times-Roman findfont\n";
    file_unit << "0.20 inch scalefont\n";
    file_unit << "setfont\n";
    file_unit << "%\n";

    for ( point = 0; point < point_num; point++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - point_xy[0+point*2]         ) * double( x_ps_min )   
        + (       + point_xy[0+point*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                       - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - point_xy[1+point*2]         ) * double( y_ps_min )   
        + (         point_xy[1+point*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                       - y_min ) );

      file_unit << "  " << x_ps
                << "  " << y_ps + 5
                << "  moveto (" << point+1 << ") show\n";
    }
  }

  file_unit << "%\n";
  file_unit << "restore  showpage\n";
  file_unit << "%\n";
  file_unit << "%  End of page.\n";
  file_unit << "%\n";
  file_unit << "%%Trailer\n";
  file_unit << "%%EOF\n";

  file_unit.close ( );

  return;
}